

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c++
# Opt level: O2

CappedArray<char,_32UL> *
kj::operator*(CappedArray<char,_32UL> *__return_storage_ptr__,long param_2,unsigned_long *param_3)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sStack_a0;
  StringPtr local_90;
  ArrayPtr<char> local_80;
  long local_70;
  CappedArray<char,_26UL> digits;
  ArrayPtr<char> local_40;
  StringPtr local_30;
  
  local_70 = -param_2;
  if (0 < param_2) {
    local_70 = param_2;
  }
  toCharSequence<unsigned_long&>(&digits,(kj *)&local_70,param_3);
  if (digits.currentSize < 10) {
    if (digits.currentSize < 7) {
      if (digits.currentSize < 4) {
        local_90.content.ptr = "ns";
        sStack_a0 = 1;
        local_90.content.size_ = 3;
        sVar4 = sStack_a0;
        local_80.size_ = digits.currentSize;
      }
      else {
        local_80.size_ = digits.currentSize - 3;
        local_90.content.ptr = anon_var_dwarf_a4cd3b;
        sVar4 = 1000;
        sStack_a0 = 4;
        local_90.content.size_ = sStack_a0;
      }
    }
    else {
      local_80.size_ = digits.currentSize - 6;
      local_90.content.ptr = "ms";
      sVar4 = 1000000;
      sStack_a0 = 3;
      local_90.content.size_ = sStack_a0;
    }
  }
  else {
    local_80.size_ = digits.currentSize - 9;
    local_90.content.ptr = "s";
    sVar4 = 1000000000;
    sStack_a0 = 2;
    local_90.content.size_ = sStack_a0;
  }
  __return_storage_ptr__->currentSize = 0x20;
  pcVar3 = __return_storage_ptr__->content;
  if (param_2 < 0) {
    pcVar3 = __return_storage_ptr__->content + 1;
    __return_storage_ptr__->content[0] = '-';
  }
  local_80.ptr = digits.content;
  if (param_2 % (long)sVar4 == 0) {
    pcVar3 = _::fillLimited<kj::ArrayPtr<char>,kj::StringPtr&>
                       (pcVar3,(char *)(__return_storage_ptr__ + 1),&local_80,&local_90);
  }
  else {
    pcVar2 = digits.content + (digits.currentSize - 1);
    local_40.size_ = (digits.currentSize - local_80.size_) + 1;
    do {
      local_40.size_ = local_40.size_ - 1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + -1;
    } while (cVar1 == '0');
    local_30.content.ptr = ".";
    local_30.content.size_ = 2;
    local_40.ptr = local_80.ptr + local_80.size_;
    pcVar3 = _::fillLimited<kj::ArrayPtr<char>,kj::StringPtr,kj::ArrayPtr<char>,kj::StringPtr&>
                       (pcVar3,(char *)(__return_storage_ptr__ + 1),&local_80,&local_30,&local_40,
                        &local_90);
  }
  __return_storage_ptr__->currentSize = (long)pcVar3 - (long)__return_storage_ptr__->content;
  return __return_storage_ptr__;
}

Assistant:

CappedArray<char, _::TIME_STR_LEN> KJ_STRINGIFY(Duration d) {
  bool negative = d < 0 * kj::SECONDS;
  uint64_t ns = d / kj::NANOSECONDS;
  if (negative) {
    ns = -ns;
  }

  auto digits = kj::toCharSequence(ns);
  ArrayPtr<char> arr = digits;

  size_t point;
  kj::StringPtr suffix;
  kj::Duration unit;
  if (digits.size() > 9) {
    point = arr.size() - 9;
    suffix = "s";
    unit = kj::SECONDS;
  } else if (digits.size() > 6) {
    point = arr.size() - 6;
    suffix = "ms";
    unit = kj::MILLISECONDS;
  } else if (digits.size() > 3) {
    point = arr.size() - 3;
    suffix = "μs";
    unit = kj::MICROSECONDS;
  } else {
    point = arr.size();
    suffix = "ns";
    unit = kj::NANOSECONDS;
  }

  CappedArray<char, _::TIME_STR_LEN> result;
  char* begin = result.begin();
  char* end;
  if (negative) {
    *begin++ = '-';
  }
  if (d % unit == 0 * kj::NANOSECONDS) {
    end = _::fillLimited(begin, result.end(), arr.first(point), suffix);
  } else {
    while (arr.back() == '0') {
      arr = arr.first(arr.size() - 1);
    }
    KJ_DASSERT(arr.size() > point);
    end = _::fillLimited(begin, result.end(), arr.first(point), "."_kj,
        arr.slice(point, arr.size()), suffix);
  }
  result.setSize(end - result.begin());
  return result;
}